

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  int iVar3;
  ImDrawList *draw_list;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  ImU32 tab_id;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar9;
  ImGuiTabItem *pIVar10;
  size_t sVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  ImGuiTabItemFlags flags_00;
  int iVar15;
  ImS8 IVar16;
  ImGuiCol idx;
  undefined1 uVar17;
  undefined7 uVar20;
  undefined8 uVar18;
  ImGuiWindow *pIVar19;
  uint uVar21;
  int iVar22;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_98;
  ImGuiWindow *local_80;
  uint local_74;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  bool *local_48;
  char *local_40;
  int local_38;
  uint local_34;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar5 = GImGui;
  local_80 = GImGui->CurrentWindow;
  if (local_80->SkipItems != false) {
    return false;
  }
  tab_id = TabBarCalcTabID(tab_bar,label);
  if ((p_open == (bool *)0x0) || (*p_open != false)) {
    local_48 = (bool *)0x0;
    uVar21 = flags;
    if (((uint)flags >> 0x14 & 1) == 0) {
      local_48 = p_open;
      uVar21 = flags | 0x100000;
    }
    if (p_open != (bool *)0x0) {
      uVar21 = flags;
    }
    IVar4 = TabItemCalcSize(label,local_48 != (bool *)0x0);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_4_ = IVar4.x;
    local_58._4_4_ = IVar4.y;
    local_58._12_4_ = extraout_XMM0_Dd;
    pIVar9 = TabBarFindTabByID(tab_bar,tab_id);
    local_68 = (ImVec2)pIVar9;
    if (pIVar9 == (ImGuiTabItem *)0x0) {
      iVar15 = (tab_bar->Tabs).Size;
      iVar3 = (tab_bar->Tabs).Capacity;
      if (iVar15 == iVar3) {
        iVar15 = iVar15 + 1;
        if (iVar3 == 0) {
          iVar13 = 8;
        }
        else {
          iVar13 = iVar3 / 2 + iVar3;
        }
        if (iVar15 < iVar13) {
          iVar15 = iVar13;
        }
        if (iVar3 < iVar15) {
          pIVar10 = (ImGuiTabItem *)MemAlloc((long)iVar15 << 5);
          pIVar9 = (tab_bar->Tabs).Data;
          if (pIVar9 != (ImGuiTabItem *)0x0) {
            memcpy(pIVar10,pIVar9,(long)(tab_bar->Tabs).Size << 5);
            MemFree((tab_bar->Tabs).Data);
          }
          (tab_bar->Tabs).Data = pIVar10;
          (tab_bar->Tabs).Capacity = iVar15;
        }
      }
      pIVar10 = (tab_bar->Tabs).Data;
      iVar15 = (tab_bar->Tabs).Size;
      pIVar9 = pIVar10 + iVar15;
      pIVar9->ID = 0;
      pIVar9->Flags = 0;
      pIVar9->LastFrameVisible = -1;
      pIVar9->LastFrameSelected = -1;
      pIVar10[iVar15].NameOffset = -1;
      pIVar10[iVar15].Offset = 0.0;
      pIVar10[iVar15].Width = 0.0;
      pIVar10[iVar15].ContentWidth = 0.0;
      iVar15 = (tab_bar->Tabs).Size;
      (tab_bar->Tabs).Size = iVar15 + 1;
      if (iVar15 < 0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
      }
      pIVar10 = (tab_bar->Tabs).Data;
      iVar15 = (tab_bar->Tabs).Size;
      pIVar9 = pIVar10 + (long)iVar15 + -1;
      pIVar9->ID = tab_id;
      pIVar10[(long)iVar15 + -1].Width = (float)local_58._0_4_;
    }
    pIVar10 = (tab_bar->Tabs).Data;
    local_40 = label;
    if ((pIVar9 < pIVar10) || (pIVar10 + (tab_bar->Tabs).Size <= pIVar9)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x625,"index_from_ptr","ImGui ASSERT FAILED: %s","it >= Data && it < Data + Size"
                 );
    }
    pcVar6 = local_40;
    tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar9 - *(int *)&(tab_bar->Tabs).Data) >> 5);
    pIVar9->ContentWidth = (float)local_58._0_4_;
    local_74 = tab_bar->Flags;
    iVar14 = tab_bar->PrevFrameVisible + 1;
    iVar15 = pIVar5->FrameCount;
    iVar22 = pIVar9->LastFrameVisible + 1;
    pIVar9->LastFrameVisible = iVar15;
    pIVar9->Flags = uVar21;
    iVar3 = (tab_bar->TabsNames).Buf.Size;
    iVar13 = iVar3 + -1;
    if (iVar3 == 0) {
      iVar13 = 0;
    }
    pIVar9->NameOffset = iVar13;
    sVar11 = strlen(local_40);
    ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar6,pcVar6 + sVar11 + 1);
    pIVar19 = local_80;
    if (iVar22 < iVar15) {
      if ((((tab_bar->Flags & 2U) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
         ((iVar15 <= iVar14 || (tab_bar->SelectedTabId == 0)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
    }
    else if ((tab_bar->Flags & 1U) == 0) {
      fVar2 = tab_bar->OffsetNextTab;
      pIVar9->Offset = fVar2;
      tab_bar->OffsetNextTab = pIVar9->Width + (pIVar5->Style).ItemInnerSpacing.x + fVar2;
    }
    if (((uVar21 & 2) != 0) && (tab_bar->SelectedTabId != tab_id)) {
      tab_bar->NextSelectedTabId = tab_id;
    }
    uVar20 = (undefined7)((ulong)&tab_bar->TabsNames >> 8);
    if (tab_bar->VisibleTabId == tab_id) {
      tab_bar->VisibleTabWasSubmitted = true;
      uVar18 = CONCAT71(uVar20,1);
    }
    else if ((tab_bar->SelectedTabId == 0 && iVar14 < iVar15) && ((tab_bar->Tabs).Size == 1)) {
      uVar18 = CONCAT71(uVar20,(tab_bar->Flags & 2) == 0);
    }
    else {
      uVar18 = 0;
    }
    if ((iVar15 <= iVar22) || (local_68 != (ImVec2)0x0 && iVar14 < iVar15)) {
      if (tab_bar->SelectedTabId == tab_id) {
        pIVar9->LastFrameSelected = pIVar5->FrameCount;
      }
      local_68 = (local_80->DC).CursorPos;
      IVar4 = (tab_bar->BarRect).Min;
      local_98.Min.x = (float)(int)(pIVar9->Offset - tab_bar->ScrollingAnim) + IVar4.x;
      local_98.Min.y = IVar4.y + 0.0;
      local_98.Max.x = pIVar9->Width;
      (local_80->DC).CursorPos = local_98.Min;
      local_98.Max.x = local_98.Max.x + local_98.Min.x;
      local_98.Max.y = (float)local_58._4_4_ + local_98.Min.y;
      fVar2 = (tab_bar->BarRect).Min.x;
      bVar8 = true;
      if (fVar2 <= local_98.Min.x) {
        pIVar1 = &(tab_bar->BarRect).Max;
        bVar8 = pIVar1->x <= local_98.Max.x && local_98.Max.x != pIVar1->x;
      }
      local_58._0_8_ = uVar18;
      local_38 = iVar22;
      local_34 = uVar21;
      if (bVar8) {
        local_60.y = local_98.Min.y + -1.0;
        local_60.x = (float)(~-(uint)(fVar2 <= local_98.Min.x) & (uint)fVar2 |
                            (uint)local_98.Min.x & -(uint)(fVar2 <= local_98.Min.x));
        local_70.x = (tab_bar->BarRect).Max.x;
        local_70.y = local_98.Max.y;
        PushClipRect(&local_60,&local_70,true);
      }
      IVar4 = (pIVar19->DC).CursorMaxPos;
      local_60.x = local_98.Max.x - local_98.Min.x;
      local_60.y = local_98.Max.y - local_98.Min.y;
      ItemSize(&local_60,(pIVar5->Style).FramePadding.y);
      (pIVar19->DC).CursorMaxPos = IVar4;
      bVar7 = ItemAdd(&local_98,tab_id,(ImRect *)0x0);
      if (!bVar7) {
        uVar17 = local_58[0];
        if (bVar8) {
          PopClipRect();
        }
        (local_80->DC).CursorPos = local_68;
        return (bool)uVar17;
      }
      bVar7 = ButtonBehavior(&local_98,tab_id,(bool *)&local_60,(bool *)&local_70,
                             (uint)pIVar5->DragDropActive << 6 | 0x102);
      pIVar19 = local_80;
      if (bVar7) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      local_60.x._0_1_ = local_60.x._0_1_ | pIVar5->HoveredId == tab_id;
      if (local_70.x._0_1_ == '\0') {
        SetItemAllowOverlap();
      }
      if ((((local_70.x._0_1_ == '\x01') && (iVar15 <= local_38)) &&
          (bVar7 = IsMouseDragging(0,-1.0), bVar7)) &&
         ((pIVar5->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
        fVar2 = (pIVar5->IO).MouseDelta.x;
        if ((0.0 <= fVar2) ||
           (pIVar1 = &(pIVar5->IO).MousePos,
           local_98.Min.x < pIVar1->x || local_98.Min.x == pIVar1->x)) {
          if ((fVar2 <= 0.0) || ((pIVar5->IO).MousePos.x <= local_98.Max.x)) goto LAB_001ec190;
          IVar16 = '\x01';
        }
        else {
          IVar16 = -1;
        }
        if (tab_bar->ReorderRequestTabId != 0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x1b38,"TabBarQueueChangeTabOrder","ImGui ASSERT FAILED: %s",
                      "tab_bar->ReorderRequestTabId == 0");
        }
        tab_bar->ReorderRequestTabId = pIVar9->ID;
        tab_bar->ReorderRequestDir = IVar16;
        pIVar19 = local_80;
      }
LAB_001ec190:
      pcVar6 = local_40;
      draw_list = pIVar19->DrawList;
      idx = 0x22;
      if ((local_70.x._0_1_ == '\0') && (local_60.x._0_1_ == '\0')) {
        if (local_58[0] == '\0') {
          idx = (uint)((local_74 >> 0x15 & 1) == 0) * 3 + 0x21;
        }
        else {
          idx = (uint)((local_74 >> 0x15 & 1) == 0) * 2 + 0x23;
        }
      }
      col = GetColorU32(idx,1.0);
      TabItemBackground(draw_list,&local_98,flags_00,col);
      RenderNavHighlight(&local_98,tab_id,1);
      bVar7 = IsItemHovered(8);
      if ((bVar7) &&
         ((bVar7 = IsMouseClicked(1,false), bVar7 || (bVar7 = IsMouseReleased(1), bVar7)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      uVar21 = (uint)tab_bar->Flags >> 1 & 4 | local_34;
      if (local_48 == (bool *)0x0) {
        close_button_id = 0;
      }
      else {
        close_button_id = ImGuiWindow::GetID(pIVar19,(void *)((ulong)tab_id + 1));
      }
      bVar7 = TabItemLabelAndCloseButton
                        (draw_list,&local_98,uVar21,tab_bar->FramePadding,pcVar6,tab_id,
                         close_button_id,(bool)local_58[0]);
      if ((local_48 != (bool *)0x0) && (bVar7)) {
        *local_48 = false;
        if (tab_bar->VisibleTabId == pIVar9->ID) {
          if ((pIVar9->Flags & 1U) == 0) {
            pIVar9->LastFrameVisible = -1;
            tab_bar->SelectedTabId = 0;
            tab_bar->NextSelectedTabId = 0;
          }
        }
        else if ((pIVar9->Flags & 1U) != 0) {
          tab_bar->NextSelectedTabId = pIVar9->ID;
        }
      }
      if (bVar8) {
        PopClipRect();
      }
      (pIVar19->DC).CursorPos = local_68;
      if (pIVar5->HoveredId != tab_id) {
        return (bool)local_58[0];
      }
      if (local_70.x._0_1_ != '\0') {
        return (bool)local_58[0];
      }
      if (pIVar5->HoveredIdNotActiveTimer <= 0.5) {
        return (bool)local_58[0];
      }
      bVar8 = IsItemHovered(0);
      if (!bVar8) {
        return (bool)local_58[0];
      }
      if ((tab_bar->Flags & 0x20) != 0) {
        return (bool)local_58[0];
      }
      if ((pIVar9->Flags & 0x10) != 0) {
        return (bool)local_58[0];
      }
      pcVar12 = FindRenderedTextEnd(pcVar6,(char *)0x0);
      SetTooltip("%.*s",(ulong)(uint)((int)pcVar12 - (int)pcVar6),pcVar6);
      return (bool)local_58[0];
    }
    PushItemFlag(0x18,true);
  }
  else {
    PushItemFlag(0x18,true);
    uVar18 = 0;
  }
  local_98.Max.x = 0.0;
  local_98.Max.y = 0.0;
  local_98.Min.x = 0.0;
  local_98.Min.y = 0.0;
  ItemAdd(&local_98,tab_id,(ImRect *)0x0);
  PopItemFlag();
  return SUB81(uVar18,0);
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}